

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

size_t beast::detail::base64::encode<void>(void *dest,void *src,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_40;
  size_t n;
  char *tab;
  char *in;
  char *out;
  size_t len_local;
  void *src_local;
  void *dest_local;
  
  pcVar1 = get_alphabet();
  local_40 = len / 3;
  tab = (char *)src;
  in = (char *)dest;
  while (local_40 != 0) {
    *in = pcVar1[(int)((int)*tab & 0xfcU) >> 2];
    in[1] = pcVar1[(int)(((int)*tab & 3U) * 0x10 + ((int)((int)tab[1] & 0xf0U) >> 4))];
    pcVar3 = in + 3;
    in[2] = pcVar1[(int)(((int)((int)tab[2] & 0xc0U) >> 6) + ((int)tab[1] & 0xfU) * 4)];
    in = in + 4;
    *pcVar3 = pcVar1[(int)((int)tab[2] & 0x3f)];
    tab = tab + 3;
    local_40 = local_40 - 1;
  }
  uVar2 = len % 3;
  if (uVar2 != 0) {
    if (uVar2 == 1) {
      *in = pcVar1[(int)((int)*tab & 0xfcU) >> 2];
      in[1] = pcVar1[(int)(((int)*tab & 3U) << 4)];
      pcVar1 = in + 3;
      in[2] = '=';
      in = in + 4;
      *pcVar1 = '=';
    }
    else if (uVar2 == 2) {
      *in = pcVar1[(int)((int)*tab & 0xfcU) >> 2];
      in[1] = pcVar1[(int)(((int)*tab & 3U) * 0x10 + ((int)((int)tab[1] & 0xf0U) >> 4))];
      pcVar3 = in + 3;
      in[2] = pcVar1[(int)(((int)tab[1] & 0xfU) << 2)];
      in = in + 4;
      *pcVar3 = '=';
    }
  }
  return (long)in - (long)dest;
}

Assistant:

std::size_t
encode(void* dest, void const* src, std::size_t len)
{
    char*      out = static_cast<char*>(dest);
    char const* in = static_cast<char const*>(src);
    auto const tab = base64::get_alphabet();

    for(auto n = len / 3; n--;)
    {
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4) + ((in[1] & 0xf0) >> 4)];
        *out++ = tab[((in[2] & 0xc0) >> 6) + ((in[1] & 0x0f) << 2)];
        *out++ = tab[  in[2] & 0x3f];
        in += 3;
    }

    switch(len % 3)
    {
    case 2:
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4) + ((in[1] & 0xf0) >> 4)];
        *out++ = tab[                         (in[1] & 0x0f) << 2];
        *out++ = '=';
        break;

    case 1:
        *out++ = tab[ (in[0] & 0xfc) >> 2];
        *out++ = tab[((in[0] & 0x03) << 4)];
        *out++ = '=';
        *out++ = '=';
        break;

    case 0:
        break;
    }

    return out - static_cast<char*>(dest);
}